

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::SendRTCPData(RTPUDPv6Transmitter *this,void *data,size_t len)

{
  int __fd;
  bool bVar1;
  RTPIPv6Destination *this_00;
  sockaddr_in6 *__addr;
  size_t len_local;
  void *data_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else if (this->maxpacksize < len) {
    this_local._4_4_ = -0x75;
  }
  else {
    RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
    ::GotoFirstElement(&this->destinations);
    while( true ) {
      bVar1 = RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
              ::HasCurrentElement(&this->destinations);
      if (!bVar1) break;
      __fd = this->rtcpsock;
      this_00 = RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                ::GetCurrentElement(&this->destinations);
      __addr = RTPIPv6Destination::GetRTCPSockAddr(this_00);
      sendto(__fd,data,len,0,(sockaddr *)__addr,0x1c);
      RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
      ::GotoNextElement(&this->destinations);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::SendRTCPData(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	destinations.GotoFirstElement();
	while (destinations.HasCurrentElement())
	{
		sendto(rtcpsock,(const char *)data,len,0,(const struct sockaddr *)destinations.GetCurrentElement().GetRTCPSockAddr(),sizeof(struct sockaddr_in6));
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}